

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

void RegexTree::lastpos(tree_node *ptr,StateSet *s)

{
  bool bVar1;
  StateSet *s_local;
  tree_node *ptr_local;
  
  if ((ptr != (tree_node *)0x0) && (ptr->c != '\a')) {
    s_local = (StateSet *)ptr;
    if ((ptr->left == (tree_node *)0x0) && (ptr->right == (tree_node *)0x0)) {
      std::
      unordered_set<const_tree_node_*,_std::hash<const_tree_node_*>,_std::equal_to<const_tree_node_*>,_std::allocator<const_tree_node_*>_>
      ::insert(s,(value_type *)&s_local);
    }
    if (*(char *)&(s_local->_M_h)._M_before_begin._M_nxt == '\n') {
      lastpos((tree_node *)(s_local->_M_h)._M_buckets,s);
      lastpos((tree_node *)(s_local->_M_h)._M_bucket_count,s);
    }
    else if (*(char *)&(s_local->_M_h)._M_before_begin._M_nxt == '\b') {
      bVar1 = nullable((tree_node *)(s_local->_M_h)._M_bucket_count);
      if (bVar1) {
        lastpos((tree_node *)(s_local->_M_h)._M_buckets,s);
        lastpos((tree_node *)(s_local->_M_h)._M_bucket_count,s);
      }
      else {
        lastpos((tree_node *)(s_local->_M_h)._M_bucket_count,s);
      }
    }
    else if (*(char *)&(s_local->_M_h)._M_before_begin._M_nxt == '\t') {
      lastpos((tree_node *)(s_local->_M_h)._M_buckets,s);
    }
  }
  return;
}

Assistant:

void RegexTree::lastpos(const tree_node *ptr, RegexTree::StateSet &s) {
    if (ptr == nullptr || ptr->c == EPSILON) return;
    if (ptr->left == nullptr && ptr->right == nullptr)
        s.insert(ptr);
    if (ptr->c == OR) {
        lastpos(ptr->left, s);
        lastpos(ptr->right, s);
        return;
    }
    if (ptr->c == CAT) {
        if (nullable(ptr->right)) {
            lastpos(ptr->left, s);
            lastpos(ptr->right, s);
        } else
            lastpos(ptr->right, s);
        return;
    }
    if (ptr->c == STAR)
        lastpos(ptr->left, s);
}